

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::DArray
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t size)

{
  void *placement;
  ArrayMapEntry<unsigned_int> *pAVar1;
  
  this->_size = size;
  this->_capacity = size;
  if (size == 0) {
    pAVar1 = (ArrayMapEntry<unsigned_int> *)0x0;
  }
  else {
    placement = Lib::alloc(size << 3);
    pAVar1 = array_new<Lib::ArrayMapEntry<unsigned_int>>(placement,this->_capacity);
  }
  this->_array = pAVar1;
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }